

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::create_pipeline_int8_x86(Convolution_x86_avx512 *this,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  uint uVar15;
  uint uVar16;
  _func_int *p_Var17;
  size_t sVar18;
  Allocator *pAVar19;
  _func_int **pp_Var20;
  int *piVar21;
  long *plVar22;
  size_t sVar23;
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  int num_input;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  ulong uVar30;
  long lVar31;
  void *pvVar32;
  ulong uVar33;
  undefined2 *puVar34;
  undefined2 *puVar35;
  int j;
  byte bVar36;
  undefined4 uVar37;
  int i_2;
  long lVar38;
  int iVar39;
  long lVar40;
  int i;
  int iVar41;
  int iVar42;
  uint *puVar43;
  int i_4;
  long lVar44;
  int i_1;
  int p;
  long lVar45;
  undefined2 *puVar46;
  ulong uVar47;
  undefined2 *puVar48;
  bool bVar49;
  byte bVar50;
  float fVar51;
  undefined8 local_c0;
  undefined1 local_b8 [64];
  size_t local_78;
  ulong local_70;
  undefined8 local_68;
  undefined4 local_5c;
  short sStack_58;
  uint auStack_56 [9];
  
  p_Var17 = this->_vptr_Convolution_x86_avx512[-3];
  iVar39 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
  iVar41 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
  uVar33 = (long)*(int *)(p_Var17 + 0x14 + (long)&(this->weight_winograd43_data).data) /
           (long)(iVar41 * iVar39);
  uVar15 = *(uint *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
  uVar33 = (long)((ulong)(uint)((int)uVar33 >> 0x1f) << 0x20 | uVar33 & 0xffffffff) /
           (long)(int)uVar15;
  uVar27 = uVar33 & 0xffffffff;
  bVar36 = opt->use_packing_layout;
  num_input = (int)uVar33;
  local_c0 = (void *)(long)num_input;
  if ((bool)bVar36 == true) {
    bVar49 = (uVar33 & 7) == 0;
    bVar50 = (uVar15 & 3) != 0;
    local_68 = (_func_int *)(CONCAT44(local_68._4_4_,num_input) & 0xffffffff00000007);
    if ((uVar33 & 7) == 0 && (uVar15 & 3) == 0) {
      if (((iVar41 == 1 && iVar39 == 1) &&
          (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) ||
          ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2 &&
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))))) {
        iVar39 = 1;
        iVar41 = iVar39;
      }
      else {
        if ((((opt->use_winograd_convolution == true) &&
             (((iVar41 == 3 && (iVar39 == 3)) && (opt->use_winograd43_convolution != false)))) &&
            (((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) {
          local_78 = 0;
          local_b8._0_8_ = (void *)0x0;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          local_b8._16_8_ = 0;
          local_b8._24_4_ = 0;
          local_b8._32_8_ = (Allocator *)0x0;
          local_b8._40_4_ = 0;
          local_b8._44_4_ = 0;
          local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
          uVar47 = 0;
          Mat::create((Mat *)local_b8,0x24,num_input,uVar15,2,(Allocator *)0x0);
          uVar33 = 0;
          if (0 < num_input) {
            uVar33 = uVar27;
          }
          local_70 = 0;
          if (0 < (int)uVar15) {
            local_70 = (ulong)uVar15;
          }
          local_5c = num_input * 9;
          for (; uVar47 != local_70; uVar47 = uVar47 + 1) {
            lVar45 = (long)(num_input * 9 * (int)uVar47) +
                     *(long *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
            pvVar32 = (void *)(local_b8._16_8_ * local_78 * uVar47 + local_b8._0_8_);
            for (uVar28 = 0; uVar28 != uVar33; uVar28 = uVar28 + 1) {
              lVar31 = uVar28 * 9;
              cVar3 = *(char *)(lVar45 + lVar31);
              cVar4 = *(char *)(lVar45 + 1 + lVar31);
              cVar5 = *(char *)(lVar45 + 2 + lVar31);
              cVar6 = *(char *)(lVar45 + 3 + lVar31);
              cVar7 = *(char *)(lVar45 + 4 + lVar31);
              cVar8 = *(char *)(lVar45 + 5 + lVar31);
              cVar9 = *(char *)(lVar45 + 6 + lVar31);
              cVar10 = *(char *)(lVar45 + 7 + lVar31);
              cVar11 = *(char *)(lVar45 + 8 + lVar31);
              for (lVar31 = 4; lVar31 != 0x28; lVar31 = lVar31 + 6) {
                sVar12 = *(short *)((long)_ps512_cephes_log_q2 + lVar31 + 0x3c);
                sVar13 = *(short *)((long)_ps512_cephes_log_q2 + lVar31 + 0x3e);
                sVar14 = *(short *)((long)&DAT_004f2740 + lVar31);
                *(short *)((long)&local_5c + lVar31) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_5c + lVar31 + 2) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)((long)auStack_56 + lVar31 + -2) =
                     sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar29 = pvVar32;
              for (lVar31 = 0; lVar31 != 6; lVar31 = lVar31 + 1) {
                sVar12 = *(short *)((long)auStack_56 + lVar31 * 6 + -2);
                uVar16 = *(uint *)((long)auStack_56 + lVar31 * 6);
                puVar43 = &DAT_004f2742;
                for (lVar40 = 0; lVar40 != 6; lVar40 = lVar40 + 1) {
                  auVar24 = vpmullw_avx(ZEXT416(*puVar43),ZEXT416(uVar16));
                  uVar37 = vpextrw_avx(auVar24,1);
                  *(short *)((long)pvVar29 + lVar40 * 2) =
                       (short)uVar37 + auVar24._0_2_ + *(short *)((long)puVar43 + -2) * sVar12;
                  puVar43 = (uint *)((long)puVar43 + 6);
                }
                pvVar29 = (void *)((long)pvVar29 + 0xc);
              }
              pvVar32 = (void *)((long)pvVar32 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
            }
          }
          Mat::create(&this->weight_winograd43_data,
                      (int)((long)((ulong)(uint)(num_input >> 0x1f) << 0x20 | uVar27) / 8),0x24,
                      (int)uVar15 / 4,0x40,0x20,(Allocator *)0x0);
          iVar39 = (this->weight_winograd43_data).w;
          pvVar32 = (this->weight_winograd43_data).data;
          sVar18 = (this->weight_winograd43_data).elemsize;
          sVar23 = (this->weight_winograd43_data).cstep;
          for (uVar33 = 0; (long)(uVar33 | 3) < (long)(int)uVar15; uVar33 = uVar33 + 4) {
            lVar45 = 0;
            for (lVar31 = 0; lVar31 != 0x24; lVar31 = lVar31 + 1) {
              lVar40 = (long)pvVar32 +
                       (long)iVar39 * sVar18 * lVar31 + (uVar33 >> 2) * sVar23 * sVar18;
              puVar34 = (undefined2 *)
                        (local_78 * local_b8._16_8_ * uVar33 + lVar45 + local_b8._0_8_);
              for (uVar47 = 0; (long)(uVar47 | 7) < (long)local_c0; uVar47 = uVar47 + 8) {
                puVar48 = puVar34;
                for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
                  puVar46 = puVar48;
                  for (lVar38 = 0; lVar38 != 0x10; lVar38 = lVar38 + 2) {
                    *(undefined2 *)(lVar40 + lVar38) = *puVar46;
                    puVar46 = (undefined2 *)
                              ((long)puVar46 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
                  }
                  puVar48 = (undefined2 *)((long)puVar48 + local_78 * local_b8._16_8_);
                  lVar40 = lVar40 + 0x10;
                }
                puVar34 = puVar34 + (long)(int)local_b8._44_4_ * local_b8._16_8_ * 4;
              }
              lVar45 = lVar45 + 2;
            }
          }
          piVar21 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
                free((void *)local_b8._0_8_);
              }
              else {
                (*(*(_func_int ***)local_b8._32_8_)[3])();
              }
            }
          }
          goto LAB_001b9543;
        }
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,uVar15,iVar39,iVar41,8,4);
          goto LAB_001b9612;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar15,iVar39,iVar41);
      goto LAB_001b9612;
    }
LAB_001b9543:
    bVar36 = bVar49;
    if (((uVar15 & 3) == 0) && ((int)local_68 != 0)) {
      p_Var17 = this->_vptr_Convolution_x86_avx512[-3];
      iVar39 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
      if (iVar39 == 7) {
        if ((((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) != 7) ||
             (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))
        goto LAB_001ba273;
        iVar41 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar39 = 7;
        iVar42 = iVar39;
      }
      else if (iVar39 == 3) {
        if ((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) != 3) ||
           ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)))) &&
            ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) != 2)) ||
             (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) != 2))))))
        goto LAB_001ba273;
        iVar41 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar39 = 3;
        iVar42 = iVar39;
      }
      else if (((iVar39 == 1) &&
               (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
                 ((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))) &&
                (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) ||
               ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
                (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
        iVar41 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar39 = 1;
        iVar42 = iVar39;
      }
      else {
LAB_001ba273:
        iVar41 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        iVar42 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,iVar41,iVar39,iVar42,1,4);
          goto LAB_001ba33a;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,iVar41,iVar39,iVar42);
      goto LAB_001ba33a;
    }
  }
  else {
    bVar49 = false;
LAB_001b9612:
    bVar50 = bVar36 ^ 1;
  }
  if ((bVar50 != 0) && (bVar49)) {
    p_Var17 = (_func_int *)
              ((long)&this->_vptr_Convolution_x86_avx512 +
              (long)this->_vptr_Convolution_x86_avx512[-3]);
    iVar39 = *(int *)(this->_vptr_Convolution_x86_avx512[-3] + 0x2c +
                     (long)&(this->weight_winograd23_data).data);
    if (((iVar39 == 1) && (*(int *)(p_Var17 + 0xd8) == 1)) &&
       (((((*(int *)(p_Var17 + 0xdc) == 1 && (*(int *)(p_Var17 + 0xe0) == 1)) &&
          (*(int *)(p_Var17 + 0xe4) == 1)) && (*(int *)(p_Var17 + 0xe8) == 1)) ||
        ((((*(int *)(p_Var17 + 0xdc) == 1 && (*(int *)(p_Var17 + 0xe0) == 1)) &&
          (*(int *)(p_Var17 + 0xe4) == 2)) && (*(int *)(p_Var17 + 0xe8) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x160),&this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0xd0),1,1);
    }
    else if ((((opt->use_winograd_convolution == true) && (iVar39 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((*(int *)(p_Var17 + 0xd8) == 3 && (*(int *)(p_Var17 + 0xdc) == 1)))))) &&
            ((*(int *)(p_Var17 + 0xe0) == 1 &&
             ((*(int *)(p_Var17 + 0xe4) == 1 && (*(int *)(p_Var17 + 0xe8) == 1)))))) {
      uVar15 = *(uint *)(p_Var17 + 0xd0);
      local_78 = 0;
      local_b8._0_8_ = (void *)0x0;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
      local_b8._16_8_ = 0;
      local_b8._24_4_ = 0;
      local_b8._32_8_ = (Allocator *)0x0;
      local_b8._40_4_ = 0;
      local_b8._44_4_ = 0;
      local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      uVar47 = 0;
      local_68 = p_Var17;
      Mat::create((Mat *)local_b8,0x24,num_input,uVar15,2,(Allocator *)0x0);
      uVar33 = 0;
      if (0 < num_input) {
        uVar33 = uVar27;
      }
      local_70 = CONCAT44(local_70._4_4_,uVar15);
      uVar28 = 0;
      if (0 < (int)uVar15) {
        uVar28 = (ulong)uVar15;
      }
      for (; uVar47 != uVar28; uVar47 = uVar47 + 1) {
        lVar45 = (long)(num_input * 9 * (int)uVar47) + *(long *)(local_68 + 0x160);
        pvVar32 = (void *)(local_b8._16_8_ * local_78 * uVar47 + local_b8._0_8_);
        for (uVar30 = 0; uVar30 != uVar33; uVar30 = uVar30 + 1) {
          lVar31 = uVar30 * 9;
          cVar3 = *(char *)(lVar45 + lVar31);
          cVar4 = *(char *)(lVar45 + 1 + lVar31);
          cVar5 = *(char *)(lVar45 + 2 + lVar31);
          cVar6 = *(char *)(lVar45 + 3 + lVar31);
          cVar7 = *(char *)(lVar45 + 4 + lVar31);
          cVar8 = *(char *)(lVar45 + 5 + lVar31);
          cVar9 = *(char *)(lVar45 + 6 + lVar31);
          cVar10 = *(char *)(lVar45 + 7 + lVar31);
          cVar11 = *(char *)(lVar45 + 8 + lVar31);
          for (lVar31 = 4; lVar31 != 0x28; lVar31 = lVar31 + 6) {
            sVar12 = *(short *)((long)_ps512_cephes_log_q2 + lVar31 + 0x3c);
            sVar13 = *(short *)((long)_ps512_cephes_log_q2 + lVar31 + 0x3e);
            sVar14 = *(short *)((long)&DAT_004f2740 + lVar31);
            *(short *)((long)&local_5c + lVar31) = sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
            *(short *)((long)&local_5c + lVar31 + 2) =
                 sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
            *(short *)((long)auStack_56 + lVar31 + -2) =
                 sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
          }
          pvVar29 = pvVar32;
          for (lVar31 = 0; lVar31 != 6; lVar31 = lVar31 + 1) {
            sVar12 = *(short *)((long)auStack_56 + lVar31 * 6 + -2);
            uVar16 = *(uint *)((long)auStack_56 + lVar31 * 6);
            puVar43 = &DAT_004f2742;
            for (lVar40 = 0; lVar40 != 6; lVar40 = lVar40 + 1) {
              auVar24 = vpmullw_avx(ZEXT416(*puVar43),ZEXT416(uVar16));
              uVar37 = vpextrw_avx(auVar24,1);
              *(short *)((long)pvVar29 + lVar40 * 2) =
                   (short)uVar37 + auVar24._0_2_ + *(short *)((long)puVar43 + -2) * sVar12;
              puVar43 = (uint *)((long)puVar43 + 6);
            }
            pvVar29 = (void *)((long)pvVar29 + 0xc);
          }
          pvVar32 = (void *)((long)pvVar32 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
        }
      }
      Mat::create(&this->weight_winograd43_data,num_input,0x24,((int)uVar15 / 4) * -3 + uVar15,8,4,
                  (Allocator *)0x0);
      iVar39 = (this->weight_winograd43_data).w;
      pvVar32 = (this->weight_winograd43_data).data;
      sVar18 = (this->weight_winograd43_data).elemsize;
      sVar23 = (this->weight_winograd43_data).cstep;
      for (uVar33 = 0; (long)(uVar33 | 3) < (long)(int)uVar15; uVar33 = uVar33 + 4) {
        lVar45 = 0;
        for (lVar31 = 0; lVar31 != 0x24; lVar31 = lVar31 + 1) {
          lVar40 = (long)pvVar32 + (long)iVar39 * sVar18 * lVar31 + (uVar33 >> 2) * sVar23 * sVar18;
          puVar34 = (undefined2 *)(local_78 * local_b8._16_8_ * uVar33 + lVar45 + local_b8._0_8_);
          for (uVar47 = 0; (long)(uVar47 | 7) < (long)local_c0; uVar47 = uVar47 + 8) {
            puVar48 = puVar34;
            for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
              puVar46 = puVar48;
              for (lVar38 = 0; lVar38 != 0x10; lVar38 = lVar38 + 2) {
                *(undefined2 *)(lVar40 + lVar38) = *puVar46;
                puVar46 = (undefined2 *)
                          ((long)puVar46 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
              }
              puVar48 = (undefined2 *)((long)puVar48 + local_78 * local_b8._16_8_);
              lVar40 = lVar40 + 0x10;
            }
            puVar34 = puVar34 + (long)(int)local_b8._44_4_ * local_b8._16_8_ * 4;
          }
          lVar45 = lVar45 + 2;
        }
      }
      iVar39 = (this->weight_winograd43_data).w;
      pvVar32 = (this->weight_winograd43_data).data;
      sVar18 = (this->weight_winograd43_data).elemsize;
      sVar23 = (this->weight_winograd43_data).cstep;
      puVar34 = (undefined2 *)(local_b8._16_8_ * local_78 * uVar33 + local_b8._0_8_);
      for (; (long)uVar33 < (long)(int)uVar15; uVar33 = uVar33 + 1) {
        puVar48 = puVar34;
        for (lVar45 = 0; lVar45 != 0x24; lVar45 = lVar45 + 1) {
          lVar31 = (long)pvVar32 +
                   (long)iVar39 * sVar18 * lVar45 +
                   (ulong)(((uint)uVar33 & 3) + ((uint)(uVar33 >> 2) & 0x3fffffff)) *
                   sVar23 * sVar18;
          puVar46 = puVar48;
          for (uVar47 = 0; (long)(uVar47 | 7) < (long)local_c0; uVar47 = uVar47 + 8) {
            puVar35 = puVar46;
            for (lVar40 = 0; lVar40 != 0x10; lVar40 = lVar40 + 2) {
              *(undefined2 *)(lVar31 + lVar40) = *puVar35;
              puVar35 = (undefined2 *)((long)puVar35 + (long)(int)local_b8._44_4_ * local_b8._16_8_)
              ;
            }
            puVar46 = puVar46 + (long)(int)local_b8._44_4_ * local_b8._16_8_ * 4;
            lVar31 = lVar31 + 0x10;
          }
          puVar48 = puVar48 + 1;
        }
        puVar34 = (undefined2 *)((long)puVar34 + local_b8._16_8_ * local_78);
      }
      piVar21 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
      if (piVar21 != (int *)0x0) {
        LOCK();
        *piVar21 = *piVar21 + -1;
        UNLOCK();
        if (*piVar21 == 0) {
          if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
            free((void *)local_b8._0_8_);
          }
          else {
            (*(*(_func_int ***)local_b8._32_8_)[3])();
          }
        }
      }
    }
    else if (opt->use_sgemm_convolution == true) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var17 + 0x160),&this->weight_sgemm_data,num_input,
                 *(int *)(p_Var17 + 0xd0),iVar39,*(int *)(p_Var17 + 0xd8));
    }
    else {
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var17 + 0x160),&this->weight_data_tm,num_input,*(int *)(p_Var17 + 0xd0),
                 iVar39,*(int *)(p_Var17 + 0xd8),8,1);
    }
  }
  if ((bVar50 & (bVar36 ^ 1)) == 1) {
    p_Var17 = this->_vptr_Convolution_x86_avx512[-3];
    iVar39 = *(int *)(p_Var17 + 0x2c + (long)&(this->weight_winograd23_data).data);
    if (((iVar39 == 1) &&
        (*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
         (((*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) ||
        ((((*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 2)))))) {
      iVar42 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      iVar41 = 1;
      iVar39 = iVar41;
    }
    else {
      if ((((opt->use_winograd_convolution == true) && (iVar39 == 3)) &&
          (((opt->use_winograd23_convolution != false &&
            (((*(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var17 + 0x34 + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var17 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var17 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
         (0xf < num_input)) {
        iVar41 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
        if (0xf < (long)iVar41) {
          Mat::create(&this->weight_winograd23_data,0x10,num_input,iVar41,2,(Allocator *)0x0);
          for (lVar45 = 0; lVar45 != iVar41; lVar45 = lVar45 + 1) {
            lVar31 = (long)(num_input * 9 * (int)lVar45) +
                     *(long *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
            iVar39 = (this->weight_winograd23_data).w;
            sVar18 = (this->weight_winograd23_data).elemsize;
            pvVar32 = (void *)(sVar18 * (this->weight_winograd23_data).cstep * lVar45 +
                              (long)(this->weight_winograd23_data).data);
            for (uVar33 = 0; pvVar29 = pvVar32, uVar33 != uVar27; uVar33 = uVar33 + 1) {
              lVar40 = uVar33 * 9;
              cVar3 = *(char *)(lVar31 + lVar40);
              cVar4 = *(char *)(lVar31 + 1 + lVar40);
              cVar5 = *(char *)(lVar31 + 2 + lVar40);
              cVar6 = *(char *)(lVar31 + 3 + lVar40);
              cVar7 = *(char *)(lVar31 + 4 + lVar40);
              cVar8 = *(char *)(lVar31 + 5 + lVar40);
              cVar9 = *(char *)(lVar31 + 6 + lVar40);
              cVar10 = *(char *)(lVar31 + 7 + lVar40);
              cVar11 = *(char *)(lVar31 + 8 + lVar40);
              for (lVar40 = 4; lVar40 != 0x1c; lVar40 = lVar40 + 6) {
                sVar12 = *(short *)(&UNK_004f276c + lVar40);
                sVar13 = *(short *)(&UNK_004f276e + lVar40);
                sVar14 = *(short *)((long)&DAT_004f2770 + lVar40);
                *(short *)((long)&local_c0 + lVar40 + 4) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_c0 + lVar40 + 6) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)(local_b8 + lVar40) = sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar32 = pvVar29;
              for (lVar40 = 0; lVar40 != 4; lVar40 = lVar40 + 1) {
                sVar12 = *(short *)(local_b8 + lVar40 * 6);
                uVar15 = *(uint *)(local_b8 + lVar40 * 6 + 2);
                puVar43 = &DAT_004f2772;
                for (lVar44 = 0; lVar44 != 4; lVar44 = lVar44 + 1) {
                  auVar24 = vpmullw_avx(ZEXT416(*puVar43),ZEXT416(uVar15));
                  uVar37 = vpextrw_avx(auVar24,1);
                  *(short *)((long)pvVar32 + lVar44 * 2) =
                       (short)uVar37 + auVar24._0_2_ + *(short *)((long)puVar43 + -2) * sVar12;
                  puVar43 = (uint *)((long)puVar43 + 6);
                }
                pvVar32 = (void *)((long)pvVar32 + 8);
              }
              pvVar32 = (void *)((long)pvVar29 + (long)iVar39 * sVar18);
              local_c0 = pvVar29;
            }
          }
          goto LAB_001ba33a;
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var17 != (_func_int *)0xfffffffffffffeb8) {
          piVar21 = *(int **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + 1;
            UNLOCK();
          }
          piVar21 = (this->weight_data_tm).refcount;
          if (piVar21 != (int *)0x0) {
            LOCK();
            *piVar21 = *piVar21 + -1;
            UNLOCK();
            if (*piVar21 == 0) {
              pAVar19 = (this->weight_data_tm).allocator;
              if (pAVar19 == (Allocator *)0x0) {
                free((this->weight_data_tm).data);
              }
              else {
                (*pAVar19->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined1 (*) [16])((long)&(this->weight_data_tm).refcount + 4) = (undefined1  [16])0x0
          ;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          piVar21 = *(int **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data + 8);
          (this->weight_data_tm).data =
               *(void **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).refcount = piVar21;
          (this->weight_data_tm).elemsize =
               *(size_t *)(p_Var17 + 0x38 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).elempack =
               *(int *)(p_Var17 + 0x40 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).allocator =
               *(Allocator **)((long)&this->convolution_dilation1 + (long)p_Var17);
          p_Var1 = (_func_int *)((long)&this->gemm + (long)p_Var17);
          uVar25 = *(undefined8 *)p_Var1;
          uVar26 = *(undefined8 *)(p_Var1 + 8);
          (this->weight_data_tm).dims = (int)uVar25;
          (this->weight_data_tm).w = (int)((ulong)uVar25 >> 0x20);
          (this->weight_data_tm).h = (int)uVar26;
          (this->weight_data_tm).d = (int)((ulong)uVar26 >> 0x20);
          (this->weight_data_tm).c = *(int *)(p_Var17 + 8 + (long)&(this->scale_in_data).data);
          (this->weight_data_tm).cstep =
               *(size_t *)(p_Var17 + 0x10 + (long)&(this->scale_in_data).data);
        }
        goto LAB_001ba33a;
      }
      iVar42 = *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      iVar41 = *(int *)(p_Var17 + 0x30 + (long)&(this->weight_winograd23_data).data);
    }
    convolution_im2col_sgemm_transform_kernel_int8_sse
              ((Mat *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,num_input,iVar42,iVar39,iVar41);
  }
LAB_001ba33a:
  Mat::create(&this->scale_in_data,
              *(int *)(this->_vptr_Convolution_x86_avx512[-3] + 0x28 +
                      (long)&(this->weight_winograd23_data).data),4,(Allocator *)0x0);
  pp_Var20 = this->_vptr_Convolution_x86_avx512;
  pvVar32 = (this->scale_in_data).data;
  for (lVar45 = 0; p_Var17 = pp_Var20[-3],
      lVar45 < *(int *)(p_Var17 + 0x28 + (long)&(this->weight_winograd23_data).data);
      lVar45 = lVar45 + 1) {
    fVar2 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var17) + lVar45 * 4);
    fVar51 = 0.0;
    if (fVar2 != 0.0) {
      fVar51 = 1.0 / (fVar2 * **(float **)(&this->field_0x238 + (long)p_Var17));
    }
    *(float *)((long)pvVar32 + lVar45 * 4) = fVar51;
  }
  if (opt->lightmode != false) {
    piVar21 = *(int **)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data);
    if (piVar21 != (int *)0x0) {
      LOCK();
      *piVar21 = *piVar21 + -1;
      UNLOCK();
      if (*piVar21 == 0) {
        plVar22 = *(long **)((long)&this->convolution_dilation1 + (long)p_Var17);
        if (plVar22 == (long *)0x0) {
          free(*(void **)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data));
        }
        else {
          (**(code **)(*plVar22 + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var17 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x34 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x28 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var17 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)((long)&this->gemm + (long)p_Var17) = 0;
    *(undefined8 *)(p_Var17 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var17 + 8 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}